

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O3

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ZeroPageQueue::PushZeroPageEntry(ZeroPageQueue *this,FreePageEntry *entry)

{
  CriticalSection *this_00;
  
  this_00 = &(this->super_BackgroundPageQueue).backgroundPageQueueCriticalSection;
  CCLock::Enter(&this_00->super_CCLock);
  entry->Next = this->pendingZeroPageList;
  this->pendingZeroPageList = entry;
  CCLock::Leave(&this_00->super_CCLock);
  return;
}

Assistant:

void PushZeroPageEntry(FreePageEntry* entry)
        {
#if SUPPORT_WIN32_SLIST
            ::InterlockedPushEntrySList(&pendingZeroPageList, entry);
#else
            AutoCriticalSection autoCS(&this->backgroundPageQueueCriticalSection);
            entry->Next = pendingZeroPageList;
            pendingZeroPageList = entry;
#endif
        }